

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  size_type *psVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pcVar6;
  _Alloc_hider _Var7;
  pointer *this_00;
  ulong uVar8;
  pointer pAVar9;
  long lVar10;
  undefined1 local_150 [8];
  Text usage;
  Text desc;
  char *local_90;
  long local_88;
  char local_80 [16];
  pointer local_70;
  pointer local_68;
  pointer local_60;
  size_t local_58;
  undefined1 local_50 [8];
  string usageCol;
  
  pAVar9 = (this->m_options).
           super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->m_options).
             super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = (pointer)indent;
  local_60 = pAVar9;
  local_58 = width;
  if (pAVar9 == local_68) {
    _Var7._M_p = (pointer)0x0;
  }
  else {
    pcVar6 = (pointer)0x0;
    do {
      Arg::commands_abi_cxx11_((string *)local_150,pAVar9);
      _Var7 = usage.str._M_dataplus;
      if (usage.str._M_dataplus._M_p < pcVar6) {
        _Var7._M_p = pcVar6;
      }
      if (local_150 != (undefined1  [8])&usage.str._M_string_length) {
        operator_delete((void *)local_150);
      }
      pAVar9 = pAVar9 + 1;
      pcVar6 = _Var7._M_p;
    } while (pAVar9 != local_68);
  }
  if (local_60 != local_68) {
    pcVar6 = _Var7._M_p + (long)local_70;
    local_58 = (local_58 - (long)_Var7._M_p) - 3;
    psVar1 = &usageCol._M_string_length;
    desc.lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(_Var7._M_p + (long)local_70 + 2);
    pAVar9 = local_60;
    do {
      this_00 = &usage.lines.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      Arg::commands_abi_cxx11_((string *)this_00,pAVar9);
      local_50 = (undefined1  [8])0xffffffffffffffff;
      usageCol.field_2._M_local_buf[0] = '\t';
      usageCol._M_dataplus._M_p = local_70;
      usageCol._M_string_length = (size_type)pcVar6;
      ::Tbc::Text::Text((Text *)local_150,(string *)this_00,(TextAttributes *)local_50);
      if (usage.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&desc.str._M_string_length)
      {
        operator_delete(usage.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_50 = (undefined1  [8])0xffffffffffffffff;
      usageCol._M_dataplus._M_p = (pointer)0x0;
      usageCol.field_2._M_local_buf[0] = '\t';
      usageCol._M_string_length = local_58;
      local_60 = pAVar9;
      ::Tbc::Text::Text((Text *)this_00,
                        &(pAVar9->super_CommonArgProperties<Catch::ConfigData>).description,
                        (TextAttributes *)local_50);
      if (0x1f < (ulong)((long)desc.lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - desc.attr._24_8_ |
                        (long)usage.lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - usage.attr._24_8_)) {
        uVar4 = (long)usage.lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - usage.attr._24_8_ >> 5;
        lVar10 = 8;
        uVar8 = 0;
        do {
          local_50 = (undefined1  [8])psVar1;
          if (uVar8 < uVar4) {
            lVar2 = *(long *)(usage.attr._24_8_ + -8 + lVar10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,lVar2,*(long *)(usage.attr._24_8_ + lVar10) + lVar2);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)local_50,(long)usageCol._M_dataplus._M_p);
          if ((uVar8 < (ulong)((long)desc.lines.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - desc.attr._24_8_ >>
                              5)) && (*(long *)(desc.attr._24_8_ + lVar10) != 0)) {
            local_90 = local_80;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_90,
                       (char)desc.lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                       (char)usageCol._M_dataplus._M_p);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_90,local_88);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,*(char **)(desc.attr._24_8_ + -8 + lVar10),
                       *(long *)(desc.attr._24_8_ + lVar10));
            if (local_90 != local_80) {
              operator_delete(local_90);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          if (local_50 != (undefined1  [8])psVar1) {
            operator_delete((void *)local_50);
          }
          uVar8 = uVar8 + 1;
          uVar4 = (long)usage.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - usage.attr._24_8_ >> 5;
          uVar5 = (long)desc.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - desc.attr._24_8_ >> 5;
          if (uVar5 < uVar4) {
            uVar5 = uVar4;
          }
          lVar10 = lVar10 + 0x20;
        } while (uVar8 < uVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&desc.attr.tabChar);
      if (usage.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&desc.str._M_string_length)
      {
        operator_delete(usage.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&usage.attr.tabChar);
      pAVar9 = local_60;
      if (local_150 != (undefined1  [8])&usage.str._M_string_length) {
        operator_delete((void *)local_150);
      }
      pAVar9 = pAVar9 + 1;
    } while (pAVar9 != local_68);
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = Detail::consoleWidth ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Detail::Text usage( it->commands(), Detail::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                Detail::Text desc( it->description, Detail::TextAttributes()
                                                        .setWidth( width - maxWidth - 3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }